

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datagram_socket.cpp
# Opt level: O0

int __thiscall sockpp::datagram_socket::open(datagram_socket *this,char *__file,int __oflag,...)

{
  bool bVar1;
  error_code *err;
  int *piVar2;
  none local_51;
  undefined1 local_50 [24];
  undefined1 local_38 [8];
  result<int> createRes;
  sa_family_t domain;
  sock_address *addr_local;
  datagram_socket *this_local;
  
  createRes.err_._M_cat._6_2_ = (**(code **)(*(long *)___oflag + 0x28))();
  create_handle((result<int> *)local_38,(uint)createRes.err_._M_cat._6_2_,0);
  bVar1 = sockpp::result::operator_cast_to_bool((result *)local_38);
  if (bVar1) {
    piVar2 = result<int>::value((result<int> *)local_38);
    socket::reset((socket *)__file,*piVar2);
    socket::bind((socket *)this,(int)__file,___oflag,0);
    bVar1 = sockpp::result::operator_cast_to_bool((result *)this);
    if (bVar1) {
      result<sockpp::none>::result((result<sockpp::none> *)this,&local_51);
    }
    else {
      (**(code **)(*(long *)__file + 0x28))(local_50);
    }
  }
  else {
    err = result<int>::error((result<int> *)local_38);
    result<sockpp::none>::result((result<sockpp::none> *)this,err);
  }
  return (int)this;
}

Assistant:

result<> datagram_socket::open(const sock_address& addr) noexcept {
    auto domain = addr.family();
    if (auto createRes = create_handle(domain); !createRes) {
        return createRes.error();
    }
    else {
        reset(createRes.value());
        if (auto res = bind(addr); !res) {
            close();
            return res;
        }
    }
    return none{};
}